

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall
pybind11::exception<ki::dml::value_error>::exception
          (exception<ki::dml::value_error> *this,handle scope,char *name,PyObject *base)

{
  bool bVar1;
  undefined8 uVar2;
  PyObject *pPVar3;
  str_attr_accessor local_170;
  allocator local_149;
  string local_148 [32];
  char local_128 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108 [32];
  exception<ki::dml::value_error> *local_e8;
  allocator local_d9;
  string local_d8 [48];
  str_attr_accessor local_a8;
  accessor<pybind11::detail::accessor_policies::str_attr> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [8];
  string full_name;
  PyObject *base_local;
  char *name_local;
  exception<ki::dml::value_error> *this_local;
  handle scope_local;
  
  this_local = (exception<ki::dml::value_error> *)scope.m_ptr;
  object::object(&this->super_object);
  detail::object_api<pybind11::handle>::attr
            (&local_a8,(object_api<pybind11::handle> *)&this_local,"__name__");
  detail::accessor<pybind11::detail::accessor_policies::str_attr>::cast<std::__cxx11::string>
            (&local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,".",&local_d9);
  std::operator+(local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_88);
  std::operator+(local_48,(char *)local_68);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::__cxx11::string::~string((string *)&local_88);
  detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_a8);
  uVar2 = std::__cxx11::string::c_str();
  pPVar3 = (PyObject *)PyErr_NewException(uVar2,base,0);
  (this->super_object).super_handle.m_ptr = pPVar3;
  local_e8 = this_local;
  bVar1 = hasattr((handle)this_local,name);
  if (!bVar1) {
    detail::object_api<pybind11::handle>::attr
              (&local_170,(object_api<pybind11::handle> *)&this_local,name);
    detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_170,this);
    detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_170);
    std::__cxx11::string::~string((string *)local_48);
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_148,name,&local_149);
  std::operator+(local_128,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "Error during initialization: multiple incompatible definitions with name \"");
  std::operator+(local_108,local_128);
  pybind11_fail(local_108);
}

Assistant:

exception(handle scope, const char *name, PyObject *base = PyExc_Exception) {
        std::string full_name = scope.attr("__name__").cast<std::string>() +
                                std::string(".") + name;
        m_ptr = PyErr_NewException(const_cast<char *>(full_name.c_str()), base, NULL);
        if (hasattr(scope, name))
            pybind11_fail("Error during initialization: multiple incompatible "
                          "definitions with name \"" + std::string(name) + "\"");
        scope.attr(name) = *this;
    }